

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
Qentem::Array<Qentem::Value<char16_t>_>::ResizeAndInitialize
          (Array<Qentem::Value<char16_t>_> *this,SizeT new_size)

{
  Value<char16_t> *pVVar1;
  Value<char16_t> *pVVar2;
  
  Resize(this,new_size);
  if (this->index_ < new_size) {
    pVVar1 = this->storage_;
    pVVar2 = pVVar1 + this->index_;
    do {
      (pVVar2->field_0).array_.storage_ = (Value<char16_t> *)0x0;
      *(SizeT *)((long)&pVVar2->field_0 + 8) = 0;
      *(SizeT *)((long)&pVVar2->field_0 + 0xc) = 0;
      pVVar2->type_ = Undefined;
      pVVar2 = pVVar2 + 1;
    } while (pVVar2 < pVVar1 + new_size);
  }
  this->index_ = this->capacity_;
  return;
}

Assistant:

void ResizeAndInitialize(SizeT new_size) {
        Resize(new_size);

        if (new_size > Size()) {
            Type_T *current = Storage();
            Memory::Initialize((current + Size()), (current + new_size));
        }

        setSize(Capacity());
    }